

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,ConstPixelBufferAccess *access,
          Vec4 *scale,Vec4 *bias,qpImageCompressionMode compression)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  ConstPixelBufferAccess local_58;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_description,pcVar1,pcVar1 + description->_M_string_length);
  (this->m_access).m_format = access->m_format;
  lVar3 = 0;
  do {
    (this->m_access).m_size.m_data[lVar3] = (access->m_size).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    (this->m_access).m_pitch.m_data[lVar3] = (access->m_pitch).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (this->m_access).m_data = access->m_data;
  lVar3 = 0;
  do {
    (this->m_scale).m_data[lVar3] = scale->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    (this->m_bias).m_data[lVar3] = bias->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  this->m_compression = compression;
  bVar2 = isCombinedDepthStencilType((access->m_format).type);
  if (bVar2) {
    if ((access->m_format).order == D) {
      getEffectiveDepthStencilAccess(&local_58,access,MODE_DEPTH);
      (this->m_access).m_data = local_58.m_data;
      *(undefined8 *)((this->m_access).m_size.m_data + 2) = local_58._16_8_;
      *(undefined8 *)((this->m_access).m_pitch.m_data + 1) = local_58.m_pitch.m_data._4_8_;
      (this->m_access).m_format = local_58.m_format;
      *(undefined8 *)(this->m_access).m_size.m_data = local_58.m_size.m_data._0_8_;
    }
    if ((access->m_format).order == S) {
      getEffectiveDepthStencilAccess(&local_58,access,MODE_STENCIL);
      (this->m_access).m_data = local_58.m_data;
      *(undefined8 *)((this->m_access).m_size.m_data + 2) = local_58._16_8_;
      *(undefined8 *)((this->m_access).m_pitch.m_data + 1) = local_58.m_pitch.m_data._4_8_;
      (this->m_access).m_format = local_58.m_format;
      *(undefined8 *)(this->m_access).m_size.m_data = local_58.m_size.m_data._0_8_;
    }
  }
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const ConstPixelBufferAccess& access, const Vec4& scale, const Vec4& bias, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(access)
	, m_scale		(scale)
	, m_bias		(bias)
	, m_compression	(compression)
{
	// Cannot set scale and bias of combined formats
	DE_ASSERT(access.getFormat().order != tcu::TextureFormat::DS);

	// Simplify access
	if (tcu::isCombinedDepthStencilType(access.getFormat().type))
	{
		if (access.getFormat().order == tcu::TextureFormat::D)
			m_access = tcu::getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH);
		if (access.getFormat().order == tcu::TextureFormat::S)
			m_access = tcu::getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL);
		else
		{
			// Cannot log a DS format
			DE_ASSERT(false);
			return;
		}
	}
}